

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GB.cpp
# Opt level: O0

RealType __thiscall
OpenMD::GB::getSuggestedCutoffRadius(GB *this,pair<OpenMD::AtomType_*,_OpenMD::AtomType_*> atypes)

{
  bool bVar1;
  double *pdVar2;
  AtomType *in_RDX;
  AtomType *in_RSI;
  long in_RDI;
  RealType RVar3;
  double dVar4;
  RealType l2;
  RealType d2;
  RealType l1;
  RealType d1;
  GayBerneAdapter gba2;
  LennardJonesAdapter lja2;
  GayBerneAdapter gba1;
  LennardJonesAdapter lja1;
  RealType cut;
  LennardJonesAdapter *in_stack_ffffffffffffff80;
  double local_78;
  GayBerneAdapter *in_stack_ffffffffffffff90;
  RealType local_68;
  double local_60;
  double local_58;
  GB *in_stack_ffffffffffffffb0;
  RealType local_48;
  GayBerneAdapter local_40;
  LennardJonesAdapter local_38;
  GayBerneAdapter local_30;
  LennardJonesAdapter local_28;
  double local_20 [2];
  AtomType *local_10;
  AtomType *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDX;
  if ((*(byte *)(in_RDI + 8) & 1) == 0) {
    initialize(in_stack_ffffffffffffffb0);
  }
  local_20[0] = 0.0;
  LennardJonesAdapter::LennardJonesAdapter(&local_28,local_10);
  GayBerneAdapter::GayBerneAdapter(&local_30,local_10);
  LennardJonesAdapter::LennardJonesAdapter(&local_38,local_8);
  GayBerneAdapter::GayBerneAdapter(&local_40,local_8);
  bVar1 = GayBerneAdapter::isGayBerne((GayBerneAdapter *)0x3c4cf7);
  if (bVar1) {
    local_48 = GayBerneAdapter::getD(in_stack_ffffffffffffff90);
    GayBerneAdapter::getL(in_stack_ffffffffffffff90);
    dVar4 = sqrt(2.0);
    pdVar2 = std::max<double>(&local_48,(double *)&stack0xffffffffffffffb0);
    local_58 = dVar4 * 2.5 * *pdVar2;
    pdVar2 = std::max<double>(local_20,&local_58);
    local_20[0] = *pdVar2;
  }
  else {
    bVar1 = LennardJonesAdapter::isLennardJones((LennardJonesAdapter *)0x3c4d83);
    if (bVar1) {
      RVar3 = LennardJonesAdapter::getSigma(in_stack_ffffffffffffff80);
      local_60 = RVar3 * 2.5;
      pdVar2 = std::max<double>(local_20,&local_60);
      local_20[0] = *pdVar2;
    }
  }
  bVar1 = GayBerneAdapter::isGayBerne((GayBerneAdapter *)0x3c4dcd);
  if (bVar1) {
    local_68 = GayBerneAdapter::getD(in_stack_ffffffffffffff90);
    GayBerneAdapter::getL(in_stack_ffffffffffffff90);
    dVar4 = sqrt(2.0);
    pdVar2 = std::max<double>(&local_68,(double *)&stack0xffffffffffffff90);
    local_78 = dVar4 * 2.5 * *pdVar2;
    pdVar2 = std::max<double>(local_20,&local_78);
    local_20[0] = *pdVar2;
  }
  else {
    bVar1 = LennardJonesAdapter::isLennardJones((LennardJonesAdapter *)0x3c4e57);
    if (bVar1) {
      LennardJonesAdapter::getSigma(in_stack_ffffffffffffff80);
      pdVar2 = std::max<double>(local_20,(double *)&stack0xffffffffffffff80);
      local_20[0] = *pdVar2;
    }
  }
  return local_20[0];
}

Assistant:

RealType GB::getSuggestedCutoffRadius(pair<AtomType*, AtomType*> atypes) {
    if (!initialized_) initialize();

    RealType cut = 0.0;

    LennardJonesAdapter lja1 = LennardJonesAdapter(atypes.first);
    GayBerneAdapter gba1     = GayBerneAdapter(atypes.first);
    LennardJonesAdapter lja2 = LennardJonesAdapter(atypes.second);
    GayBerneAdapter gba2     = GayBerneAdapter(atypes.second);

    if (gba1.isGayBerne()) {
      RealType d1 = gba1.getD();
      RealType l1 = gba1.getL();
      // sigma is actually sqrt(2)*l  for prolate ellipsoids
      cut = max(cut, RealType(2.5) * sqrt(RealType(2.0)) * max(d1, l1));
    } else if (lja1.isLennardJones()) {
      cut = max(cut, RealType(2.5) * lja1.getSigma());
    }

    if (gba2.isGayBerne()) {
      RealType d2 = gba2.getD();
      RealType l2 = gba2.getL();
      cut         = max(cut, RealType(2.5) * sqrt(RealType(2.0)) * max(d2, l2));
    } else if (lja2.isLennardJones()) {
      cut = max(cut, RealType(2.5) * lja2.getSigma());
    }

    return cut;
  }